

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall
SplitSVTest_two_words_Test<unsigned_char>::SplitSVTest_two_words_Test
          (SplitSVTest_two_words_Test<unsigned_char> *this)

{
  SplitSVTest_two_words_Test<unsigned_char> *this_local;
  
  SplitSVTest<unsigned_char>::SplitSVTest(&this->super_SplitSVTest<unsigned_char>);
  *(undefined ***)&this->super_SplitSVTest<unsigned_char> =
       &PTR__SplitSVTest_two_words_Test_0081a628;
  return;
}

Assistant:

TYPED_TEST(SplitSVTest, two_words) {
	auto word = make_word<TypeParam>();
	word += default_delim<TypeParam>;
	word += make_word<TypeParam>();
	std::basic_string_view<TypeParam> words = word;
	std::vector<std::basic_string<TypeParam>> split_result = split(words, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 2);
	EXPECT_EQ(split_result[0].size(), 8);
	EXPECT_EQ(split_result[1].size(), 8);
}